

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O1

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>::
ContIntLoadResidual_F
          (ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
           *this,ChVectorDynamic<> *R,double c)

{
  ChContactable_3vars<6,_6,_6> *pCVar1;
  int iVar2;
  undefined1 auVar3 [16];
  ChVector<double> abs_force_scaled;
  double local_48;
  double dStack_40;
  double local_38;
  double local_28;
  double dStack_20;
  undefined8 local_18;
  
  local_48 = c * (this->m_force).m_data[0];
  dStack_40 = c * (this->m_force).m_data[1];
  local_38 = c * (this->m_force).m_data[2];
  iVar2 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[2])();
  if ((char)iVar2 != '\0') {
    pCVar1 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
             ).objA;
    auVar3._0_8_ = -local_38;
    auVar3._8_8_ = 0x8000000000000000;
    local_28 = -local_48;
    dStack_20 = -dStack_40;
    local_18 = vmovlpd_avx(auVar3);
    (*(pCVar1->super_ChContactable)._vptr_ChContactable[0xc])
              (pCVar1,&local_28,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                ).p1,R);
  }
  iVar2 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
              ).objB)->super_ChContactable)._vptr_ChContactable[2])();
  if ((char)iVar2 != '\0') {
    pCVar1 = (this->
             super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
             ).objB;
    (*(pCVar1->super_ChContactable)._vptr_ChContactable[0xc])
              (pCVar1,&local_48,
               &(this->
                super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_3vars<6,_6,_6>_>
                ).p2,R);
  }
  return;
}

Assistant:

virtual void ContIntLoadResidual_F(ChVectorDynamic<>& R, const double c) override {
        ChVector<> abs_force_scaled(m_force * c);

        if (this->objA->IsContactActive())
            this->objA->ContactForceLoadResidual_F(-abs_force_scaled, this->p1, R);

        if (this->objB->IsContactActive())
            this->objB->ContactForceLoadResidual_F(abs_force_scaled, this->p2, R);
    }